

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O3

int libssh2_sftp_symlink_ex
              (LIBSSH2_SFTP *sftp,char *path,uint path_len,char *target,uint target_len,
              int link_type)

{
  char cVar1;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *pLVar2;
  uint32_t uVar3;
  int iVar4;
  uint32_t uVar5;
  time_t start_time;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  undefined4 in_register_00000084;
  uchar *s;
  size_t data_len;
  size_t in_stack_ffffffffffffff58;
  char *local_98;
  uchar *local_90;
  size_t local_88;
  uchar *local_80;
  uint32_t local_74;
  uint local_70;
  uint32_t local_6c;
  char *local_68;
  ulong local_60;
  char *local_58;
  undefined8 local_50;
  ulong local_48;
  ulong local_40;
  char *local_38;
  
  if (sftp == (LIBSSH2_SFTP *)0x0) {
    iVar4 = -0x27;
  }
  else {
    local_68 = target;
    local_38 = path;
    start_time = time((time_t *)0x0);
    iVar4 = target_len + 4;
    if (link_type != 0) {
      iVar4 = 0;
    }
    local_88 = (size_t)(path_len + 0xd + iVar4);
    local_6c = iVar4 + path_len + 9;
    local_70 = 0x10;
    if (link_type != 2) {
      local_70 = (uint)(byte)((link_type == 0) + 0x13);
    }
    local_40 = (ulong)path_len;
    local_48 = (ulong)target_len;
    local_50 = CONCAT44(in_register_00000084,target_len);
    do {
      channel = sftp->channel;
      pLVar2 = channel->session;
      local_80 = (uchar *)0x0;
      local_98 = (char *)0x0;
      if (sftp->symlink_state == libssh2_NB_state_created) {
LAB_00127f66:
        sVar6 = _libssh2_channel_write(channel,0,sftp->symlink_packet,local_88);
        if (sVar6 != 0xffffffffffffffdb) {
          (*pLVar2->free)(sftp->symlink_packet,&pLVar2->abstract);
          sftp->symlink_packet = (uchar *)0x0;
          if (sVar6 == local_88) {
            sftp->symlink_state = libssh2_NB_state_sent;
            goto LAB_00127fb9;
          }
          sftp->symlink_state = libssh2_NB_state_idle;
          iVar4 = -7;
          pcVar7 = "Unable to send SYMLINK/READLINK command";
          goto LAB_001280ed;
        }
      }
      else {
        if (sftp->symlink_state == libssh2_NB_state_idle) {
          sftp->last_errno = 0;
          if ((link_type == 2) || (2 < sftp->version)) {
            local_90 = (uchar *)(*pLVar2->alloc)(local_88,&pLVar2->abstract);
            sftp->symlink_packet = local_90;
            if (local_90 != (uchar *)0x0) {
              _libssh2_store_u32(&local_90,local_6c);
              *local_90 = (uchar)local_70;
              uVar3 = sftp->request_id;
              sftp->request_id = uVar3 + 1;
              sftp->symlink_request_id = uVar3;
              local_90 = local_90 + 1;
              _libssh2_store_u32(&local_90,uVar3);
              _libssh2_store_str(&local_90,local_38,local_40);
              if (link_type == 0) {
                _libssh2_store_str(&local_90,local_68,local_48);
              }
              sftp->symlink_state = libssh2_NB_state_created;
              goto LAB_00127f66;
            }
            iVar4 = -6;
            pcVar7 = "Unable to allocate memory for SYMLINK/READLINK/REALPATH packet";
            local_90 = (uchar *)0x0;
          }
          else {
            iVar4 = -0x1f;
            pcVar7 = "Server does not support SYMLINK or READLINK";
          }
LAB_001280ed:
          uVar3 = _libssh2_error(pLVar2,iVar4,pcVar7);
        }
        else {
LAB_00127fb9:
          iVar4 = sftp_packet_requirev
                            (sftp,0x132be6,(uchar *)(ulong)sftp->symlink_request_id,
                             (uint32_t)&local_98,&local_80,(size_t *)0x9,in_stack_ffffffffffffff58);
          if (iVar4 != 0) {
            if (iVar4 == -0x25) goto LAB_001280ff;
            if (iVar4 == -0x26) {
              if (local_80 != (uchar *)0x0) {
                (*pLVar2->free)(local_98,&pLVar2->abstract);
              }
              iVar4 = -0x1f;
              pcVar7 = "SFTP symlink packet too short";
            }
            else {
              sftp->symlink_state = libssh2_NB_state_idle;
              pcVar7 = "Error waiting for status message";
            }
            goto LAB_001280ed;
          }
          sftp->symlink_state = libssh2_NB_state_idle;
          cVar1 = *local_98;
          uVar3 = _libssh2_ntohu32((uchar *)(local_98 + 5));
          if (cVar1 == 'e') {
            (*pLVar2->free)(local_98,&pLVar2->abstract);
            if (uVar3 == 0) {
              return 0;
            }
            sftp->last_errno = uVar3;
            pcVar7 = "SFTP Protocol Error";
LAB_00128145:
            uVar3 = _libssh2_error(pLVar2,-0x1f,pcVar7);
          }
          else {
            if (uVar3 == 0) {
              (*pLVar2->free)(local_98,&pLVar2->abstract);
              pcVar7 = "Invalid READLINK/REALPATH response, no name entries";
              goto LAB_00128145;
            }
            if (local_80 < (uchar *)0xd) {
              if (local_80 != (uchar *)0x0) {
                (*pLVar2->free)(local_98,&pLVar2->abstract);
              }
              iVar4 = -0x1f;
              pcVar7 = "SFTP stat packet too short";
              goto LAB_001280ed;
            }
            uVar5 = _libssh2_ntohu32((uchar *)(local_98 + 9));
            pcVar7 = local_68;
            pcVar8 = local_98;
            uVar3 = 0xffffffda;
            if (uVar5 < (uint)local_50) {
              local_60 = (ulong)uVar5;
              local_58 = local_98;
              local_74 = uVar5;
              memcpy(local_68,local_98 + 0xd,local_60);
              pcVar7[local_60] = '\0';
              pcVar8 = local_58;
              uVar3 = local_74;
            }
            (*pLVar2->free)(pcVar8,&pLVar2->abstract);
          }
        }
        if (uVar3 != 0xffffffdb) {
          return uVar3;
        }
      }
LAB_001280ff:
      pLVar2 = sftp->channel->session;
      if (pLVar2->api_block_mode == 0) {
        return -0x25;
      }
      iVar4 = _libssh2_wait_socket(pLVar2,start_time);
    } while (iVar4 == 0);
  }
  return iVar4;
}

Assistant:

LIBSSH2_API int
libssh2_sftp_symlink_ex(LIBSSH2_SFTP *sftp, const char *path,
                        unsigned int path_len, char *target,
                        unsigned int target_len, int link_type)
{
    int rc;
    if(!sftp)
        return LIBSSH2_ERROR_BAD_USE;
    BLOCK_ADJUST(rc, sftp->channel->session,
                 sftp_symlink(sftp, path, path_len, target, target_len,
                              link_type));
    return rc;
}